

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix_svd.h
# Opt level: O3

void math::internal::matrix_svd_clear_super_entry<double>
               (int rows,int cols,double *mat_b,double *mat_q,int row_index,double *epsilon)

{
  double dVar1;
  long lVar2;
  ulong uVar3;
  double *pdVar4;
  long lVar5;
  double *pdVar6;
  long lVar7;
  long lVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  
  if (row_index + 1 < cols) {
    lVar5 = (long)(row_index * cols);
    lVar8 = (long)cols;
    lVar2 = (long)row_index + 1;
    pdVar6 = mat_b + lVar2 * lVar8;
    lVar7 = 8;
    do {
      dVar9 = mat_b[lVar2 + lVar5];
      if ((0.0 - *epsilon <= dVar9) && (dVar9 <= *epsilon)) {
        mat_b[lVar2 + lVar5] = 0.0;
        return;
      }
      dVar10 = mat_b[(cols + 1) * (int)lVar2];
      dVar11 = SQRT(dVar9 * dVar9 + dVar10 * dVar10);
      dVar11 = (double)((ulong)-dVar11 & -(ulong)(dVar10 < 0.0) |
                       ~-(ulong)(dVar10 < 0.0) & (ulong)dVar11);
      dVar10 = dVar10 / dVar11;
      dVar9 = dVar9 / dVar11;
      if (0 < cols) {
        uVar3 = 0;
        do {
          dVar11 = mat_b[lVar5 + uVar3];
          dVar1 = pdVar6[uVar3];
          mat_b[lVar5 + uVar3] = dVar10 * dVar11 + dVar1 * -dVar9;
          pdVar6[uVar3] = dVar11 * dVar9 + dVar1 * dVar10;
          uVar3 = uVar3 + 1;
        } while ((uint)cols != uVar3);
      }
      if (0 < rows) {
        pdVar4 = mat_q + row_index;
        uVar3 = (ulong)(uint)rows;
        do {
          dVar11 = *pdVar4;
          dVar1 = *(double *)((long)pdVar4 + lVar7);
          *pdVar4 = dVar10 * dVar11 + dVar1 * -dVar9;
          *(double *)((long)pdVar4 + lVar7) = dVar11 * dVar9 + dVar1 * dVar10;
          pdVar4 = pdVar4 + lVar8;
          uVar3 = uVar3 - 1;
        } while (uVar3 != 0);
      }
      lVar2 = lVar2 + 1;
      pdVar6 = pdVar6 + lVar8;
      lVar7 = lVar7 + 8;
    } while ((int)lVar2 != cols);
  }
  return;
}

Assistant:

void
matrix_svd_clear_super_entry(int rows, int cols, T* mat_b, T* mat_q,
    int row_index, T const& epsilon)
{
    for (int i = row_index + 1; i < cols; ++i)
    {
        if (MATH_EPSILON_EQ(mat_b[row_index * cols + i], T(0), epsilon))
        {
            mat_b[row_index * cols + i] = T(0);
            break;
        }

        T norm = MATH_POW2(mat_b[row_index * cols + i])
            + MATH_POW2(mat_b[i * cols + i]);
        norm = std::sqrt(norm) * MATH_SIGN(mat_b[i * cols + i]);

        T givens_c = mat_b[i * cols + i] / norm;
        T givens_s = mat_b[row_index * cols + i] / norm;
        matrix_apply_givens_row(mat_b, cols, cols, row_index,
            i, givens_c, givens_s);
        matrix_apply_givens_column(mat_q, rows, cols, row_index,
            i, givens_c, givens_s);
    }
}